

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::formatsecs(vector<char> *timebuf,uint secs)

{
  char *v;
  bool bVar1;
  int sz;
  size_t sVar2;
  char local_52 [2];
  int local_50;
  int local_4c;
  int plen;
  int blen;
  charbuf b;
  ulong uStack_28;
  uint t;
  size_t i;
  size_t tl;
  bool moded;
  uint secs_local;
  vector<char> *timebuf_local;
  
  bVar1 = false;
  uStack_28 = 0;
  tl._4_4_ = secs;
  do {
    if (4 < uStack_28) {
      return;
    }
    b._20_4_ = tl._4_4_ / *(uint *)(timedivinfos + uStack_28 * 0x10 + 8);
    if ((b._20_4_ != 0) || ((4 < uStack_28 + 1 && (!bVar1)))) {
      tl._4_4_ = tl._4_4_ % *(uint *)(timedivinfos + uStack_28 * 0x10 + 8);
      if (bVar1) {
        b._19_1_ = 0x20;
        vector<char>::add(timebuf,&b.field_0x13);
      }
      bVar1 = true;
      vector<char>::reserve((databuf<char> *)&plen,timebuf,0xb);
      local_4c = databuf<char>::remaining((databuf<char> *)&plen);
      local_50 = snprintf(_plen,(long)local_4c,"%u",(ulong)(uint)b._20_4_);
      sz = clamp<int,int>(local_50,0,local_4c + -1);
      vector<char>::advance(timebuf,sz);
      local_52[1] = 0x20;
      vector<char>::add(timebuf,local_52 + 1);
      v = *(char **)(timedivinfos + uStack_28 * 0x10);
      sVar2 = strlen(*(char **)(timedivinfos + uStack_28 * 0x10));
      vector<char>::put(timebuf,v,(int)sVar2);
      if (b._20_4_ != 1) {
        local_52[0] = 's';
        vector<char>::add(timebuf,local_52);
      }
      if (tl._4_4_ == 0) {
        return;
      }
    }
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

void formatsecs(vector<char> &timebuf, uint secs)
    {
        bool moded = false;
        const size_t tl = sizeof(timedivinfos)/sizeof(timedivinfos[0]);
        for(size_t i = 0; i < tl; i++)
        {
            uint t = secs / timedivinfos[i].timediv;
            if(!t && (i+1<tl || moded)) continue;
            secs %= timedivinfos[i].timediv;
            if(moded) timebuf.add(' ');
            moded = true;
            charbuf b = timebuf.reserve(10 + 1);
            int blen = b.remaining();
            int plen = snprintf(b.buf, blen, "%u", t);
            timebuf.advance(clamp(plen, 0, blen-1));
            timebuf.add(' ');
            timebuf.put(timedivinfos[i].name, strlen(timedivinfos[i].name));
            if(t != 1) timebuf.add('s');
            if(!secs) break;
        }
    }